

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

EGLConfig deqp::egl::getEGLConfig(Library *egl,EGLDisplay eglDisplay,EGLenum surfaceType)

{
  EGLenum EVar1;
  EGLenum *pEVar2;
  mapped_type *pmVar3;
  EGLConfig pvVar4;
  key_type local_68 [5];
  key_type local_54;
  undefined1 local_50 [8];
  AttribMap attribMap;
  EGLenum surfaceType_local;
  EGLDisplay eglDisplay_local;
  Library *egl_local;
  
  attribMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = surfaceType;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_50)
  ;
  EVar1 = attribMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  local_54 = 0x3033;
  pEVar2 = (EGLenum *)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_50,&local_54);
  *pEVar2 = EVar1;
  local_68[0] = 0x3040;
  pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_50,local_68);
  *pmVar3 = 4;
  pvVar4 = eglu::chooseSingleConfig(egl,eglDisplay,(AttribMap *)local_50);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_50)
  ;
  return pvVar4;
}

Assistant:

EGLConfig getEGLConfig (const Library& egl, const EGLDisplay eglDisplay, EGLenum surfaceType)
{
	AttribMap attribMap;

	attribMap[EGL_SURFACE_TYPE]		= surfaceType;
	attribMap[EGL_RENDERABLE_TYPE]	= EGL_OPENGL_ES2_BIT;

	return eglu::chooseSingleConfig(egl, eglDisplay, attribMap);
}